

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O0

void __thiscall
ary::AnchoredLocalization::draw(AnchoredLocalization *this,Mat *image,SharedCameraModel *model)

{
  pointer pPVar1;
  const_reference pvVar2;
  Localization *pLVar3;
  const_reference pvVar4;
  SceneAnchor *this_00;
  MatCommaInitializer_<float> *pMVar5;
  MatCommaInitializer_ *this_01;
  CameraModel *pCVar6;
  _OutputArray *p_Var7;
  Matx<float,_4,_1> hv;
  Mat local_4b0;
  Matx33f local_44c;
  CameraPosition local_428;
  Scalar_<double> local_410;
  Point_ local_3f0 [8];
  undefined1 local_3e8 [56];
  Scalar_<double> local_3b0;
  Point_ local_390 [8];
  Point_ local_388 [8];
  _InputOutputArray local_380;
  _OutputArray local_368;
  Mat local_350;
  _InputArray local_2f0;
  Matx33f local_2d4;
  _InputArray local_2b0;
  _InputArray local_298;
  _InputArray local_280;
  _InputArray local_268;
  undefined1 local_250 [8];
  CameraPosition camera;
  MatCommaInitializer_<float> local_1d8;
  Mat local_1b0;
  undefined1 local_150 [8];
  Mat modelPts;
  Scalar_<double> local_e0;
  Scalar local_c0;
  undefined8 local_9c;
  undefined8 local_94;
  float local_8c;
  float local_88;
  Point3f origin;
  Matx44f offset;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> model2ImagePts;
  size_t i;
  SharedCameraModel *model_local;
  Mat *image_local;
  AnchoredLocalization *this_local;
  
  model2ImagePts.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pPVar1 = (pointer)std::
                      vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
                      ::size(&this->localizations);
    if (pPVar1 <= model2ImagePts.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage) break;
    pvVar2 = std::vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>::
             operator[](&this->localizations,
                        (size_type)
                        model2ImagePts.
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    pLVar3 = cv::Ptr<ary::Localization>::operator->(pvVar2);
    (*pLVar3->_vptr_Localization[3])(pLVar3,image,model);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)(offset.val + 0xe))
    ;
    pvVar4 = std::vector<cv::Ptr<ary::SceneAnchor>,_std::allocator<cv::Ptr<ary::SceneAnchor>_>_>::
             operator[](&this->anchors,
                        (size_type)
                        model2ImagePts.
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = cv::Ptr<ary::SceneAnchor>::operator->(pvVar4);
    SceneAnchor::getTransform((Matx44f *)&origin.y,this_00);
    cv::Scalar_<double>::Scalar_(&local_e0,0.0,0.0,0.0,1.0);
    cv::operator*(&local_c0,(Matx<float,_4,_4> *)&origin.y,&local_e0);
    hv = cv::Matx::operator_cast_to_Matx((Matx *)&local_c0);
    local_94 = hv.val._8_8_;
    local_9c = hv.val._0_8_;
    extract_homogeneous((Matx41f)hv.val);
    cv::Mat_<float>::Mat_((Mat_<float> *)(camera.translation.val + 1),3,3);
    cv::operator<<(&local_1d8,(Mat_<float> *)(camera.translation.val + 1),0.01);
    pMVar5 = cv::MatCommaInitializer_<float>::operator_(&local_1d8,0.01);
    pMVar5 = cv::MatCommaInitializer_<float>::operator_(pMVar5,0.01);
    pMVar5 = cv::MatCommaInitializer_<float>::operator_(pMVar5,0);
    pMVar5 = cv::MatCommaInitializer_<float>::operator_(pMVar5,0);
    pMVar5 = cv::MatCommaInitializer_<float>::operator_(pMVar5,0);
    pMVar5 = cv::MatCommaInitializer_<float>::operator_(pMVar5,local_8c);
    pMVar5 = cv::MatCommaInitializer_<float>::operator_(pMVar5,local_88);
    this_01 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<float>::operator_(pMVar5,origin.x);
    cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<float> *)&local_1b0,this_01);
    cv::Mat::Mat((Mat *)local_150,&local_1b0);
    cv::Mat_<float>::~Mat_((Mat_<float> *)&local_1b0);
    cv::Mat_<float>::~Mat_((Mat_<float> *)(camera.translation.val + 1));
    pvVar2 = std::vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>::
             operator[](&this->localizations,
                        (size_type)
                        model2ImagePts.
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    pLVar3 = cv::Ptr<ary::Localization>::operator->(pvVar2);
    (*pLVar3->_vptr_Localization[2])(local_250);
    cv::_InputArray::_InputArray(&local_268,(Mat *)local_150);
    cv::_InputArray::_InputArray<float,3,1>(&local_280,(Matx<float,_3,_1> *)local_250);
    cv::_InputArray::_InputArray<float,3,1>
              (&local_298,(Matx<float,_3,_1> *)(camera.rotation.val + 1));
    pCVar6 = cv::Ptr<ary::CameraModel>::operator->(model);
    CameraModel::getIntrinsics(&local_2d4,pCVar6);
    cv::_InputArray::_InputArray<float,3,3>(&local_2b0,&local_2d4);
    pCVar6 = cv::Ptr<ary::CameraModel>::operator->(model);
    CameraModel::getDistortion(&local_350,pCVar6);
    cv::_InputArray::_InputArray(&local_2f0,&local_350);
    cv::_OutputArray::_OutputArray<cv::Point_<float>>
              (&local_368,
               (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)(offset.val + 0xe))
    ;
    p_Var7 = (_OutputArray *)cv::noArray();
    cv::projectPoints(&local_268,&local_280,&local_298,&local_2b0,&local_2f0,&local_368,p_Var7,0.0);
    cv::_OutputArray::~_OutputArray(&local_368);
    cv::_InputArray::~_InputArray(&local_2f0);
    cv::Mat::~Mat(&local_350);
    cv::_InputArray::~_InputArray(&local_2b0);
    cv::_InputArray::~_InputArray(&local_298);
    cv::_InputArray::~_InputArray(&local_280);
    cv::_InputArray::~_InputArray(&local_268);
    cv::_InputOutputArray::_InputOutputArray(&local_380,image);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)(offset.val + 0xe),
               1);
    cv::Point_::operator_cast_to_Point_(local_388);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)(offset.val + 0xe),
               2);
    cv::Point_::operator_cast_to_Point_(local_390);
    cv::Scalar_<double>::Scalar_(&local_3b0,255.0,255.0,0.0,0.0);
    cv::line(&local_380,local_388,local_390,&local_3b0,2,8,(ulong)p_Var7 & 0xffffffff00000000);
    cv::_InputOutputArray::~_InputOutputArray(&local_380);
    cv::_InputOutputArray::_InputOutputArray((_InputOutputArray *)(local_3e8 + 0x20),image);
    pvVar4 = std::vector<cv::Ptr<ary::SceneAnchor>,_std::allocator<cv::Ptr<ary::SceneAnchor>_>_>::
             operator[](&this->anchors,
                        (size_type)
                        model2ImagePts.
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::Ptr<ary::SceneAnchor>::operator->(pvVar4);
    SceneAnchor::getName_abi_cxx11_((SceneAnchor *)local_3e8);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)(offset.val + 0xe),
               0);
    cv::Point_::operator_cast_to_Point_(local_3f0);
    cv::Scalar_<double>::Scalar_(&local_410,255.0,100.0,255.0,0.0);
    cv::putText(0,local_3e8 + 0x20,local_3e8,local_3f0,0,&local_410,2,8,0);
    std::__cxx11::string::~string((string *)local_3e8);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)(local_3e8 + 0x20));
    cv::Mat::~Mat((Mat *)local_150);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)(offset.val + 0xe))
    ;
    model2ImagePts.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(model2ImagePts.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->x + 1);
  }
  (*(this->super_Localization)._vptr_Localization[2])();
  pCVar6 = cv::Ptr<ary::CameraModel>::operator->(model);
  CameraModel::getIntrinsics(&local_44c,pCVar6);
  pCVar6 = cv::Ptr<ary::CameraModel>::operator->(model);
  CameraModel::getDistortion(&local_4b0,pCVar6);
  drawSystem(image,&local_428,&local_44c,&local_4b0,0.1,3);
  cv::Mat::~Mat(&local_4b0);
  return;
}

Assistant:

void AnchoredLocalization::draw(Mat& image, SharedCameraModel& model) const {

    for (size_t i = 0; i < localizations.size(); i++) {
        localizations[i]->draw(image, model);

        std::vector<cv::Point2f> model2ImagePts;
        
        Matx44f offset = anchors[i]->getTransform();

        Point3f origin = extract_homogeneous(offset * Scalar(0, 0, 0, 1));

        Mat modelPts = (Mat_<float>(3, 3) <<
                        0.01, 0.01, 0.01,
                        0, 0, 0,
                        origin.x, origin.y, origin.z);

        CameraPosition camera = localizations[i]->getCameraPosition();

        projectPoints(modelPts, camera.rotation, camera.translation, model->getIntrinsics(), model->getDistortion(), model2ImagePts);

        line(image, model2ImagePts[1], model2ImagePts[2], Scalar(255, 255, 0), 2);

        putText(image, anchors[i]->getName(), model2ImagePts[0], FONT_HERSHEY_SIMPLEX, 0.5f, Scalar(255, 100, 255), 2);

    }

    drawSystem(image, getCameraPosition(), model->getIntrinsics(), model->getDistortion());

}